

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::DefineCachedFunctions(ByteCodeGenerator *this,FuncInfo *funcInfoParent)

{
  ParseNodeFnc *pPVar1;
  FunctionBody *this_00;
  ParseNodeFnc *pPVar2;
  uint byteCount;
  size_t plusSize;
  AuxArray<unsigned_int> *local_70;
  AuxArray<unsigned_int> *slotIdInCachedScopeToNestedIndexArray;
  FuncInfo *funcInfoParent_local;
  FuncInfoArray *info;
  AuxArray<unsigned_int> **local_50;
  AuxArray<unsigned_int> **local_48;
  anon_class_8_1_3fcf6586 local_40;
  uint local_34 [2];
  uint slotCount;
  
  pPVar2 = funcInfoParent->root;
  local_40.fn = (anon_class_24_3_523878ff *)local_34;
  local_34[0] = 0;
  slotIdInCachedScopeToNestedIndexArray = (AuxArray<unsigned_int> *)funcInfoParent;
  pPVar1 = ParseNode::AsParseNodeFnc(&pPVar2->super_ParseNode);
  info = (FuncInfoArray *)&local_40;
  MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1051:26)>
  ::anon_class_8_1_3fcf6586::operator()
            ((anon_class_8_1_3fcf6586 *)&info,pPVar1->pnodeScopes->pnodeScopes);
  if (pPVar1->pnodeBodyScope != (ParseNodeBlock *)0x0) {
    MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1051:26)>
    ::anon_class_8_1_3fcf6586::operator()
              ((anon_class_8_1_3fcf6586 *)&info,pPVar1->pnodeBodyScope->pnodeScopes);
  }
  if ((ulong)local_34[0] != 0) {
    if (0xfffffff < local_34[0]) {
      Js::Throw::OutOfMemory();
    }
    plusSize = (ulong)local_34[0] << 3;
    funcInfoParent_local = (FuncInfo *)new<Memory::ArenaAllocator>(4,this->alloc,0x35916e,0);
    funcInfoParent_local->inlineCacheCount = local_34[0];
    this_00 = FuncInfo::GetParsedFunctionBody(funcInfoParent);
    local_70 = Js::FunctionBody::AllocateSlotIdInCachedScopeToNestedIndexArray(this_00,local_34[0]);
    local_48 = &local_70;
    local_34[0] = 0;
    info = (FuncInfoArray *)&funcInfoParent_local;
    local_50 = (AuxArray<unsigned_int> **)local_34;
    pPVar1 = ParseNode::AsParseNodeFnc(&pPVar2->super_ParseNode);
    local_40.fn = (anon_class_24_3_523878ff *)&info;
    MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1080:24)>
    ::anon_class_8_1_3fcf6586::operator()(&local_40,pPVar1->pnodeScopes->pnodeScopes);
    if (pPVar1->pnodeBodyScope != (ParseNodeBlock *)0x0) {
      MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1080:24)>
      ::anon_class_8_1_3fcf6586::operator()(&local_40,pPVar1->pnodeBodyScope->pnodeScopes);
    }
    byteCount = (uint)plusSize | 4;
    Js::ByteCodeWriter::AuxNoReg
              (&this->m_writer,InitCachedFuncs,funcInfoParent_local,byteCount,byteCount);
    local_34[0] = 0;
    local_50 = &slotIdInCachedScopeToNestedIndexArray;
    info = (FuncInfoArray *)this;
    local_48 = (AuxArray<unsigned_int> **)local_34;
    pPVar2 = ParseNode::AsParseNodeFnc(&pPVar2->super_ParseNode);
    local_40.fn = (anon_class_24_3_523878ff *)&info;
    MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1102:34)>
    ::anon_class_8_1_3fcf6586::operator()
              ((anon_class_8_1_3fcf6586 *)&local_40,pPVar2->pnodeScopes->pnodeScopes);
    if (pPVar2->pnodeBodyScope != (ParseNodeBlock *)0x0) {
      MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1102:34)>
      ::anon_class_8_1_3fcf6586::operator()
                ((anon_class_8_1_3fcf6586 *)&local_40,pPVar2->pnodeBodyScope->pnodeScopes);
    }
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<Js::FuncInfoEntry>>
              (this->alloc,(AuxArray<Js::FuncInfoEntry> *)funcInfoParent_local,plusSize);
  }
  return;
}

Assistant:

void ByteCodeGenerator::DefineCachedFunctions(FuncInfo *funcInfoParent)
{
    ParseNode *pnodeParent = funcInfoParent->root;
    uint slotCount = 0;

    auto countFncSlots = [&](ParseNode *pnodeFnc)
    {
        if (pnodeFnc->AsParseNodeFnc()->GetFuncSymbol() != nullptr && pnodeFnc->AsParseNodeFnc()->IsDeclaration())
        {
            slotCount++;
        }
    };
    MapContainerScopeFunctions(pnodeParent, countFncSlots);

    if (slotCount == 0)
    {
        return;
    }

    size_t extraBytesActual = AllocSizeMath::Mul(slotCount, sizeof(Js::FuncInfoEntry));
    // Reg2Aux takes int for byteCount so we need to convert to int. OOM if we can't because it would truncate data.
    if (extraBytesActual > INT_MAX)
    {
        Js::Throw::OutOfMemory();
    }
    int extraBytes = (int)extraBytesActual;

    Js::FuncInfoArray *info = AnewPlus(alloc, extraBytes, Js::FuncInfoArray, slotCount);

    // slotCount is guaranteed to be non-zero here.
    Js::AuxArray<uint32> * slotIdInCachedScopeToNestedIndexArray = funcInfoParent->GetParsedFunctionBody()->AllocateSlotIdInCachedScopeToNestedIndexArray(slotCount);

    slotCount = 0;

    auto fillEntries = [&](ParseNode *pnodeFnc)
    {
        Symbol *sym = pnodeFnc->AsParseNodeFnc()->GetFuncSymbol();
        if (sym != nullptr && (pnodeFnc->AsParseNodeFnc()->IsDeclaration() || pnodeFnc->AsParseNodeFnc()->IsDefaultModuleExport()))
        {
            AssertMsg(!pnodeFnc->AsParseNodeFnc()->IsGenerator(), "Generator functions are not supported by InitCachedFuncs but since they always escape they should disable function caching");
            Js::FuncInfoEntry *entry = &info->elements[slotCount];
            entry->nestedIndex = pnodeFnc->AsParseNodeFnc()->nestedIndex;
            entry->scopeSlot = sym->GetScopeSlot();

            slotIdInCachedScopeToNestedIndexArray->elements[slotCount] = pnodeFnc->AsParseNodeFnc()->nestedIndex;
            slotCount++;
        }
    };
    MapContainerScopeFunctions(pnodeParent, fillEntries);

    m_writer.AuxNoReg(Js::OpCode::InitCachedFuncs,
        info,
        sizeof(Js::FuncInfoArray) + extraBytes,
        sizeof(Js::FuncInfoArray) + extraBytes);

    slotCount = 0;
    auto defineOrGetCachedFunc = [&](ParseNode *pnodeFnc)
    {
        Symbol *sym = pnodeFnc->AsParseNodeFnc()->GetFuncSymbol();
        if (pnodeFnc->AsParseNodeFnc()->IsDeclaration())
        {
            // Do we need to define the function here (i.e., is it not one of our cached locals)?
            // Only happens if the sym is null (e.g., function x.y(){}).
            if (sym == nullptr)
            {
                this->DefineOneFunction(pnodeFnc->AsParseNodeFnc(), funcInfoParent);
            }
            else if (!sym->IsInSlot(this, funcInfoParent) && sym->GetLocation() != Js::Constants::NoRegister)
            {
                // If it was defined by InitCachedFuncs, do we need to put it in a register rather than a slot?
                m_writer.Reg1Unsigned1(Js::OpCode::GetCachedFunc, sym->GetLocation(), slotCount);
            }
            // The "x = function() {...}" case is being generated on the fly, during emission,
            // so the caller expects to be able to release this register.
            funcInfoParent->ReleaseLoc(pnodeFnc);
            pnodeFnc->location = Js::Constants::NoRegister;
            slotCount++;
        }
    };
    MapContainerScopeFunctions(pnodeParent, defineOrGetCachedFunc);

    AdeletePlus(alloc, extraBytes, info);
}